

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O0

bool __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::schedule(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
           *this,task_type *task)

{
  locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
  lockedThis;
  pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *obj;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  byte local_1;
  
  obj = (pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
         *)&stack0xffffffffffffffd8;
  locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
  ::locking_ptr((locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
                 *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),obj,
                (recursive_mutex *)0x197d9b);
  locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
  ::operator->((locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
                *)obj);
  local_1 = fifo_scheduler<boost::function0<void>_>::push
                      ((fifo_scheduler<boost::function0<void>_> *)
                       CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       (task_type *)obj);
  if ((bool)local_1) {
    locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
    ::operator->((locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
                  *)&stack0xffffffffffffffd8);
    condition_variable_any::notify_one
              ((condition_variable_any *)
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
  ::~locking_ptr((locking_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>,_boost::recursive_mutex>
                  *)0x197e1e);
  return (bool)(local_1 & 1);
}

Assistant:

bool schedule(task_type const & task) volatile
    {	
      locking_ptr<pool_type, recursive_mutex> lockedThis(*this, m_monitor); 
      
      if(lockedThis->m_scheduler.push(task))
      {
        lockedThis->m_task_or_terminate_workers_event.notify_one();
        return true;
      }
      else
      {
        return false;
      }
    }